

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

ULong any_on(Bigint *b,int k)

{
  ULong *pUVar1;
  bool bVar2;
  int iVar3;
  ULong *pUVar4;
  sbyte sVar5;
  ULong x2;
  ULong x1;
  ULong *x0;
  ULong *x;
  int local_20;
  int nwds;
  int n;
  int k_local;
  Bigint *b_local;
  
  pUVar4 = b->x;
  local_20 = b->wds;
  iVar3 = k >> 5;
  if ((((local_20 < iVar3) || (bVar2 = local_20 <= iVar3, local_20 = iVar3, bVar2)) ||
      ((k & 0x1fU) == 0)) ||
     (sVar5 = (sbyte)(k & 0x1fU), (pUVar4[iVar3] >> sVar5) << sVar5 == pUVar4[iVar3])) {
    x0 = pUVar4 + local_20;
    do {
      if (x0 <= pUVar4) {
        return 0;
      }
      pUVar1 = x0 + -1;
      x0 = x0 + -1;
    } while (*pUVar1 == 0);
  }
  return 1;
}

Assistant:

static ULong
any_on(Bigint *b, int k)
{
	int n, nwds;
	ULong *x, *x0, x1, x2;

	x = b->x;
	nwds = b->wds;
	n = k >> kshift;
	if (n > nwds)
		n = nwds;
	else if (n < nwds && (k &= kmask)) {
		x1 = x2 = x[n];
		x1 >>= k;
		x1 <<= k;
		if (x1 != x2)
			return 1;
		}
	x0 = x;
	x += n;
	while(x > x0)
		if (*--x)
			return 1;
	return 0;
	}